

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_homedir(char *buffer,size_t *size)

{
  ulong uVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  uv_passwd_t pwd;
  uv_passwd_t local_50;
  
  if (size == (size_t *)0x0 || buffer == (char *)0x0) {
    return -0x16;
  }
  uVar1 = *size;
  if (uVar1 == 0) {
    return -0x16;
  }
  __s = getenv("HOME");
  if (__s == (char *)0x0) {
    iVar2 = uv__getpwuid_r(&local_50);
    if (iVar2 != 0) {
      return iVar2;
    }
    sVar3 = strlen(local_50.homedir);
    if (*size <= sVar3) {
      *size = sVar3 + 1;
      uv__free(local_50.username);
      return -0x69;
    }
    memcpy(buffer,local_50.homedir,sVar3 + 1);
    *size = sVar3;
    uv__free(local_50.username);
  }
  else {
    sVar3 = strlen(__s);
    if (uVar1 <= sVar3) {
      *size = sVar3 + 1;
      return -0x69;
    }
    memcpy(buffer,__s,sVar3 + 1);
    *size = sVar3;
  }
  return 0;
}

Assistant:

int uv_os_homedir(char* buffer, size_t* size) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Check if the HOME environment variable is set first. The task of
     performing input validation on buffer and size is taken care of by
     uv_os_getenv(). */
  r = uv_os_getenv("HOME", buffer, size);

  if (r != UV_ENOENT)
    return r;

  /* HOME is not set, so call uv__getpwuid_r() */
  r = uv__getpwuid_r(&pwd);

  if (r != 0) {
    return r;
  }

  len = strlen(pwd.homedir);

  if (len >= *size) {
    *size = len + 1;
    uv_os_free_passwd(&pwd);
    return UV_ENOBUFS;
  }

  memcpy(buffer, pwd.homedir, len + 1);
  *size = len;
  uv_os_free_passwd(&pwd);

  return 0;
}